

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# labeling_sauf_4c.h
# Opt level: O0

void __thiscall SAUF4C<RemSP>::FirstScan(SAUF4C<RemSP> *this)

{
  int iVar1;
  int iVar2;
  long lVar3;
  long lVar4;
  uint uVar5;
  uchar *puVar6;
  uint *puVar7;
  int local_44;
  int c;
  uint *img_labels_row_prev;
  uint *img_labels_row;
  uchar *img_row_prev;
  uchar *img_row;
  int r;
  int w;
  int h;
  SAUF4C<RemSP> *this_local;
  
  iVar1 = *(int *)&((this->super_Labeling2D<(Connectivity2D)4,_false>).img_)->field_0x8;
  iVar2 = *(int *)&((this->super_Labeling2D<(Connectivity2D)4,_false>).img_)->field_0xc;
  memset(*(void **)&((this->super_Labeling2D<(Connectivity2D)4,_false>).img_labels_)->field_0x10,0,
         *(long *)&((this->super_Labeling2D<(Connectivity2D)4,_false>).img_labels_)->field_0x20 -
         *(long *)&((this->super_Labeling2D<(Connectivity2D)4,_false>).img_labels_)->field_0x18);
  RemSP::Setup();
  for (img_row._4_4_ = 0; img_row._4_4_ < iVar1; img_row._4_4_ = img_row._4_4_ + 1) {
    puVar6 = cv::Mat::ptr<unsigned_char>
                       (&((this->super_Labeling2D<(Connectivity2D)4,_false>).img_)->super_Mat,
                        img_row._4_4_);
    lVar3 = **(long **)&((this->super_Labeling2D<(Connectivity2D)4,_false>).img_)->field_0x48;
    puVar7 = cv::Mat::ptr<unsigned_int>
                       (&((this->super_Labeling2D<(Connectivity2D)4,_false>).img_labels_)->super_Mat
                        ,img_row._4_4_);
    lVar4 = **(long **)&((this->super_Labeling2D<(Connectivity2D)4,_false>).img_labels_)->field_0x48
    ;
    for (local_44 = 0; local_44 < iVar2; local_44 = local_44 + 1) {
      if (puVar6[local_44] != '\0') {
        if ((img_row._4_4_ < 1) || (puVar6[local_44 - lVar3] == '\0')) {
          if ((local_44 < 1) || (puVar6[local_44 + -1] == '\0')) {
            uVar5 = RemSP::NewLabel();
            puVar7[local_44] = uVar5;
          }
          else {
            puVar7[local_44] = puVar7[local_44 + -1];
          }
        }
        else if ((local_44 < 1) || (puVar6[local_44 + -1] == '\0')) {
          puVar7[local_44] = *(uint *)((long)puVar7 + ((long)local_44 * 4 - lVar4));
        }
        else {
          uVar5 = RemSP::Merge(*(uint *)((long)puVar7 + ((long)local_44 * 4 - lVar4)),
                               puVar7[local_44 + -1]);
          puVar7[local_44] = uVar5;
        }
      }
    }
  }
  return;
}

Assistant:

void FirstScan() {

        const int h = img_.rows;
        const int w = img_.cols;

        memset(img_labels_.data, 0, img_labels_.dataend - img_labels_.datastart); // Initialization

        LabelsSolver::Setup();

        // Rosenfeld Mask
        // +-+-+-+
        // |p|q|r|
        // +-+-+-+
        // |s|x|
        // +-+-+

        // First scan
        for (int r = 0; r < h; ++r) {
            // Get row pointers
            unsigned char const * const img_row = img_.ptr<unsigned char>(r);
            unsigned char const * const img_row_prev = (unsigned char *)(((char *)img_row) - img_.step.p[0]);
            unsigned * const  img_labels_row = img_labels_.ptr<unsigned>(r);
            unsigned * const  img_labels_row_prev = (unsigned *)(((char *)img_labels_row) - img_labels_.step.p[0]);

            for (int c = 0; c < w; ++c) {
#define CONDITION_Q r > 0 && img_row_prev[c] > 0
#define CONDITION_S c > 0 && img_row[c - 1] > 0
#define CONDITION_X img_row[c] > 0

#define ACTION_1 // nothing to do 
#define ACTION_2 img_labels_row[c] = LabelsSolver::NewLabel(); // new label
#define ACTION_3 img_labels_row[c] = img_labels_row_prev[c]; // x <- q
#define ACTION_4 img_labels_row[c] = img_labels_row[c - 1]; // x <- s
#define ACTION_5 img_labels_row[c] = LabelsSolver::Merge(img_labels_row_prev[c], img_labels_row[c - 1]); // x <- p + s

#include "labeling_sauf_4c_tree.inc.h"
            }
        }

#undef ACTION_1
#undef ACTION_2
#undef ACTION_3
#undef ACTION_4
#undef ACTION_5
#undef ACTION_6
#undef ACTION_7
#undef ACTION_8

#undef CONDITION_P
#undef CONDITION_Q
#undef CONDITION_R
#undef CONDITION_S
#undef CONDITION_X
    }